

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instruction.h
# Opt level: O3

uint32_t __thiscall spvtools::opt::Operand::AsId(Operand *this)

{
  uint **ppuVar1;
  bool bVar2;
  size_t sVar3;
  uint **ppuVar4;
  
  bVar2 = spvIsIdType(this->type);
  if (!bVar2) {
    __assert_fail("spvIsIdType(type)",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/instruction.h"
                  ,0x60,"uint32_t spvtools::opt::Operand::AsId() const");
  }
  ppuVar1 = (uint **)(this->words).large_data_._M_t.
                     super___uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                     .
                     super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
                     ._M_head_impl;
  if (ppuVar1 == (uint **)0x0) {
    sVar3 = (this->words).size_;
  }
  else {
    sVar3 = (long)*(pointer *)
                   &((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)(ppuVar1 + 1))->
                    _M_impl - (long)*ppuVar1 >> 2;
  }
  if (sVar3 == 1) {
    ppuVar4 = &(this->words).small_data_;
    if (ppuVar1 != (uint **)0x0) {
      ppuVar4 = ppuVar1;
    }
    return **ppuVar4;
  }
  __assert_fail("words.size() == 1",
                "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/instruction.h"
                ,0x61,"uint32_t spvtools::opt::Operand::AsId() const");
}

Assistant:

uint32_t AsId() const {
    assert(spvIsIdType(type));
    assert(words.size() == 1);
    return words[0];
  }